

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.hpp
# Opt level: O3

string * EraseComments(string *__return_storage_ptr__,string *content)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  char *pcVar6;
  char cVar7;
  int iVar8;
  int iVar10;
  bool bVar11;
  int iVar9;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar7 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar7);
  sVar4 = content->_M_string_length;
  if (1 < (int)sVar4) {
    iVar8 = 1;
    bVar5 = false;
    do {
      bVar11 = false;
      iVar9 = iVar8;
joined_r0x00106aa9:
      while (bVar11) {
        pcVar3 = (content->_M_dataplus)._M_p;
        bVar11 = true;
        iVar9 = iVar8;
        if (pcVar3[iVar8] == '/') {
          bVar11 = pcVar3[(long)iVar8 + -1] != '*';
        }
LAB_00106ac3:
        iVar8 = iVar9 + 1;
        iVar9 = iVar8;
        if ((int)sVar4 <= iVar8) {
          return __return_storage_ptr__;
        }
      }
      if (bVar5) {
        std::__cxx11::string::push_back(cVar7);
        pcVar3 = (content->_M_dataplus)._M_p;
        if ((pcVar3[(long)iVar8 + -1] == '\\') || (bVar5 = true, pcVar3[iVar8] != '\"')) {
          bVar5 = false;
        }
        goto LAB_00106bbb;
      }
      pcVar3 = (content->_M_dataplus)._M_p;
      cVar1 = pcVar3[(long)iVar9 + -1];
      cVar2 = pcVar3[iVar9];
      if (cVar1 == '\\') {
LAB_00106b15:
        std::__cxx11::string::push_back(cVar7);
        iVar10 = iVar9 + 1;
LAB_00106b23:
        sVar4 = content->_M_string_length;
        iVar9 = iVar10;
        if ((int)sVar4 <= iVar10) {
          return __return_storage_ptr__;
        }
        goto joined_r0x00106aa9;
      }
      if (cVar1 != '/') {
        if (cVar2 != '\"') goto LAB_00106b15;
        goto LAB_00106ba8;
      }
      if (cVar2 == '/') {
        std::__cxx11::string::pop_back();
        iVar10 = iVar9 + -1;
        pcVar6 = (content->_M_dataplus)._M_p + iVar9;
        do {
          iVar10 = iVar10 + 1;
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar1 != '\n');
        goto LAB_00106b23;
      }
      if (cVar2 != '\"') {
        if (cVar2 == '*') {
          std::__cxx11::string::pop_back();
          sVar4 = content->_M_string_length;
          bVar11 = true;
          goto LAB_00106ac3;
        }
        goto LAB_00106b15;
      }
LAB_00106ba8:
      bVar5 = true;
      std::__cxx11::string::push_back(cVar7);
      iVar8 = iVar9;
LAB_00106bbb:
      iVar8 = iVar8 + 1;
      sVar4 = content->_M_string_length;
    } while (iVar8 < (int)sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EraseComments(const std::string &content) {
    std::string result;
    result += content[0];

    bool quoted = false;
    bool commented = false;

    int index = 1;
    while (index < (int)content.size()) {
        if (commented) {
            if (content[index] == '/' and content[index - 1] == '*') {
                commented = false;
            }
            index++;
            continue;
        }

        if (quoted) {
            result += content[index];
            if (content[index - 1] != '\\' and content[index] == '"') {
                ;
            } else {
                quoted = false;
            }
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '*') {
            result.pop_back();
            commented = true;
            index++;
            continue;
        }

        if (content[index - 1] == '/' and content[index] == '/') {
            result.pop_back();
            while (content[index] != '\n') {
                index++;
            }
            continue;
        }

        if (content[index - 1] != '\\' and content[index] == '\"') {
            quoted = true;
            result += content[index];
            index++;
            continue;
        }

        result += content[index];
        index++;
    }
    return result;
}